

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

packed_view_t * bwtil::load_packed_view_from_file(size_t width,size_t size,FILE *fp)

{
  packed_view<std::vector> *in_RDI;
  packed_view_t *pv;
  FILE *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  bitview_t *in_stack_ffffffffffffffc8;
  packed_view<std::vector> *in_stack_ffffffffffffffd0;
  
  bv::internal::packed_view<std::vector>::packed_view
            (in_stack_ffffffffffffffd0,(size_t)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  bv::internal::packed_view<std::vector>::bits(in_RDI);
  load_bitview_from_file
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  bv::internal::bitview<std::vector>::~bitview((bitview<std::vector> *)0x1704df);
  return in_RDI;
}

Assistant:

inline packed_view_t load_packed_view_from_file(size_t width, size_t size, FILE * fp){

	 packed_view_t pv = packed_view_t(width,size);
	 load_bitview_from_file(pv.bits(),size*width ,fp);

	 return pv;

	/*if(width<=8)
		return load_packed_view_from_file_T<uint8_t>(width, size, fp);
	if(width<=16)
		return load_packed_view_from_file_T<uint16_t>(width, size, fp);
	if(width<=32)
		return load_packed_view_from_file_T<uint32_t>(width, size, fp);

	return load_packed_view_from_file_T<uint64_t>(width, size, fp);*/

}